

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugger.cxx
# Opt level: O1

void __thiscall cmDebugger_impl::~cmDebugger_impl(cmDebugger_impl *this)

{
  ~cmDebugger_impl(this);
  operator_delete(this,0x198);
  return;
}

Assistant:

~cmDebugger_impl() override
  {
    ClearListeners();
    ClearAllWatchpoints();
    ClearAllBreakpoints();
  }